

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void av1_rc_init(AV1EncoderConfig *oxcf,RATE_CONTROL *rc)

{
  undefined4 uVar1;
  double dVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  
  rc->frames_since_key = 8;
  rc->frames_to_fwd_kf = (oxcf->kf_cfg).fwd_kf_dist;
  rc->frames_till_gf_update_due = 0;
  rc->ni_av_qi = (oxcf->rc_cfg).worst_allowed_q;
  rc->ni_tot_qi = 0;
  iVar4 = (oxcf->gf_cfg).min_gf_interval;
  rc->min_gf_interval = iVar4;
  iVar7 = (oxcf->gf_cfg).max_gf_interval;
  rc->max_gf_interval = iVar7;
  if (iVar4 == 0) {
    dVar2 = (oxcf->input_cfg).init_framerate;
    uVar1 = (oxcf->frm_dim_cfg).width;
    uVar3 = (oxcf->frm_dim_cfg).height;
    dVar8 = (double)(int)uVar3 * (double)(int)uVar1 * dVar2;
    iVar4 = (int)(dVar2 * 0.125);
    iVar6 = 0x20;
    if (iVar4 < 0x20) {
      iVar6 = iVar4;
    }
    iVar4 = 4;
    if (4 < iVar6) {
      iVar4 = iVar6;
    }
    if ((165888000.0 < dVar8) && (iVar6 = (int)((dVar8 * 4.0) / 165888000.0 + 0.5), iVar4 <= iVar6))
    {
      iVar4 = iVar6;
    }
    rc->min_gf_interval = iVar4;
  }
  if (iVar7 == 0) {
    uVar5 = (uint)((oxcf->input_cfg).init_framerate * 0.75);
    if (0x1f < (int)uVar5) {
      uVar5 = 0x20;
    }
    iVar7 = (uVar5 & 1) + uVar5;
    if (iVar7 <= iVar4) {
      iVar7 = iVar4;
    }
    if (iVar7 < 0x21) {
      iVar7 = 0x20;
    }
    rc->max_gf_interval = iVar7;
  }
  rc->avg_frame_low_motion = 0;
  rc->use_external_qp_one_pass = 0;
  rc->percent_blocks_inactive = 0;
  rc->force_max_q = 0;
  rc->postencode_drop = 0;
  rc->frames_since_scene_change = 0;
  rc->resize_state = ORIG;
  rc->resize_avg_qp = 0;
  rc->resize_buffer_underflow = 0;
  rc->resize_count = 0;
  rc->rtc_external_ratectrl = 0;
  rc->frame_level_fast_extra_bits = 0;
  return;
}

Assistant:

void av1_rc_init(const AV1EncoderConfig *oxcf, RATE_CONTROL *rc) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  rc->frames_since_key = 8;  // Sensible default for first frame.
  rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  rc->frames_till_gf_update_due = 0;
  rc->ni_av_qi = rc_cfg->worst_allowed_q;
  rc->ni_tot_qi = 0;

  rc->min_gf_interval = oxcf->gf_cfg.min_gf_interval;
  rc->max_gf_interval = oxcf->gf_cfg.max_gf_interval;
  if (rc->min_gf_interval == 0)
    rc->min_gf_interval = av1_rc_get_default_min_gf_interval(
        oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
        oxcf->input_cfg.init_framerate);
  if (rc->max_gf_interval == 0)
    rc->max_gf_interval = get_default_max_gf_interval(
        oxcf->input_cfg.init_framerate, rc->min_gf_interval);
  rc->avg_frame_low_motion = 0;

  rc->resize_state = ORIG;
  rc->resize_avg_qp = 0;
  rc->resize_buffer_underflow = 0;
  rc->resize_count = 0;
  rc->rtc_external_ratectrl = 0;
  rc->frame_level_fast_extra_bits = 0;
  rc->use_external_qp_one_pass = 0;
  rc->percent_blocks_inactive = 0;
  rc->force_max_q = 0;
  rc->postencode_drop = 0;
  rc->frames_since_scene_change = 0;
}